

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR CorUnix::CreateThreadData(CPalThread **ppThread)

{
  CPalThread *this;
  SIZE_T SVar1;
  pthread_t pVar2;
  CPalThread *pThread;
  PAL_ERROR palError;
  CPalThread **ppThread_local;
  
  this = AllocTHREAD();
  if (this == (CPalThread *)0x0) {
    pThread._4_4_ = 0xe;
  }
  else {
    pThread._4_4_ = CPalThread::RunPreCreateInitializers(this);
    if (pThread._4_4_ == 0) {
      CPalThread::SetLastError(0);
      SVar1 = syscall(0xba);
      this->m_threadId = SVar1;
      pVar2 = pthread_self();
      this->m_pthreadSelf = pVar2;
      this->m_dwLwpId = 0;
      pThread._4_4_ = CPalThread::RunPostCreateInitializers(this);
      if (pThread._4_4_ == 0) {
        *ppThread = this;
      }
    }
  }
  if ((pThread._4_4_ != 0) && (this != (CPalThread *)0x0)) {
    CPalThread::ReleaseThreadReference(this);
  }
  return pThread._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::CreateThreadData(
    CPalThread **ppThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;

    /* Create the thread object */
    pThread = AllocTHREAD();

    if (NULL == pThread)
    {
       palError = ERROR_OUTOFMEMORY;
       goto CreateThreadDataExit;
    }

    palError = pThread->RunPreCreateInitializers();

    if (NO_ERROR != palError)
    {
        goto CreateThreadDataExit;
    }

    pThread->SetLastError(0);

    pThread->m_threadId = THREADSilentGetCurrentThreadId();
    pThread->m_pthreadSelf = pthread_self();
#if HAVE_MACH_THREADS
    pThread->m_machPortSelf = pthread_mach_thread_np(pThread->m_pthreadSelf);
#endif
#if HAVE_THREAD_SELF
    pThread->m_dwLwpId = (DWORD) thread_self();
#elif HAVE__LWP_SELF
    pThread->m_dwLwpId = (DWORD) _lwp_self();
#else
    pThread->m_dwLwpId = 0;
#endif

    palError = pThread->RunPostCreateInitializers();
    if (NO_ERROR != palError)
    {
        goto CreateThreadDataExit;
    }

    *ppThread = pThread;

CreateThreadDataExit:

    if (NO_ERROR != palError)
    {
        if (NULL != pThread)
        {
            pThread->ReleaseThreadReference();
        }
    }

    return palError;
}